

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_globaltype_t * wasm_global_type(wasm_global_t *global)

{
  wasm_globaltype_t *this;
  Global *pGVar1;
  GlobalType local_28;
  
  this = (wasm_globaltype_t *)operator_new(0x18);
  pGVar1 = wasm_ref_t::As<wabt::interp::Global>((wasm_ref_t *)global);
  local_28.super_ExternType.kind = (pGVar1->type_).super_ExternType.kind;
  local_28.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0960;
  local_28._12_8_ = *(undefined8 *)&(pGVar1->type_).super_ExternType.field_0xc;
  wasm_globaltype_t::wasm_globaltype_t(this,&local_28);
  return this;
}

Assistant:

own wasm_globaltype_t* wasm_global_type(const wasm_global_t* global) {
  return new wasm_globaltype_t{global->As<Global>()->type()};
}